

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int vcf_write(htsFile *fp,bcf_hdr_t *h,bcf1_t *v)

{
  size_t nbytes;
  char *buffer;
  int iVar1;
  ssize_t sVar2;
  
  (fp->line).l = 0;
  vcf_format(h,v,&fp->line);
  nbytes = (fp->line).l;
  buffer = (fp->line).s;
  if ((fp->format).compression == no_compression) {
    sVar2 = hwrite((hFILE *)(fp->fp).bgzf,buffer,nbytes);
    iVar1 = (int)sVar2;
  }
  else {
    sVar2 = bgzf_write((fp->fp).bgzf,buffer,nbytes);
    iVar1 = (int)sVar2;
  }
  return -(uint)((long)iVar1 != (fp->line).l);
}

Assistant:

int vcf_write(htsFile *fp, const bcf_hdr_t *h, bcf1_t *v)
{
    int ret;
    fp->line.l = 0;
    vcf_format1(h, v, &fp->line);
    if ( fp->format.compression!=no_compression )
        ret = bgzf_write(fp->fp.bgzf, fp->line.s, fp->line.l);
    else
        ret = hwrite(fp->fp.hfile, fp->line.s, fp->line.l);
    return ret==fp->line.l ? 0 : -1;
}